

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dump.cc
# Opt level: O2

ostream * pstack::operator<<(ostream *os,JSON<elf_prpsinfo,_char> *jo)

{
  elf_prpsinfo *peVar1;
  ostream *poVar2;
  size_t sVar3;
  JObject *pJVar4;
  undefined1 local_b0 [8];
  string fname;
  string args;
  int local_4c;
  int local_48;
  int local_44;
  JObject local_40;
  char local_2e [2];
  bool local_2c;
  char local_2b [11];
  
  peVar1 = jo->object;
  sVar3 = strnlen(peVar1->pr_fname,0x10);
  local_b0 = (undefined1  [8])&fname._M_string_length;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_b0,peVar1->pr_fname,peVar1->pr_fname + sVar3);
  sVar3 = strnlen(peVar1->pr_psargs,0x50);
  fname.field_2._8_8_ = &args._M_string_length;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)((long)&fname.field_2 + 8),peVar1->pr_psargs,peVar1->pr_psargs + sVar3);
  local_40.sep = "";
  local_40.os = os;
  std::operator<<(os,"{ ");
  local_4c = (int)peVar1->pr_state;
  local_2e[0] = '\0';
  pJVar4 = JObject::field<char[9],int,char>(&local_40,(char (*) [9])"pr_state",&local_4c,local_2e);
  args.field_2._8_8_ = &stack0xffffffffffffffa0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)((long)&args.field_2 + 8),&peVar1->pr_sname,&peVar1->pr_zomb);
  local_2e[1] = 0;
  pJVar4 = JObject::field<char[9],std::__cxx11::string,char>
                     (pJVar4,(char (*) [9])"pr_sname",
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      ((long)&args.field_2 + 8),local_2e + 1);
  local_2c = peVar1->pr_zomb != '\0';
  local_2b[0] = '\0';
  pJVar4 = JObject::field<char[8],bool,char>(pJVar4,(char (*) [8])"pr_zomb",&local_2c,local_2b);
  local_48 = (int)peVar1->pr_nice;
  local_2b[1] = 0;
  pJVar4 = JObject::field<char[8],int,char>(pJVar4,(char (*) [8])"pr_nice",&local_48,local_2b + 1);
  local_44 = (int)peVar1->pr_flag;
  local_2b[2] = 0;
  pJVar4 = JObject::field<char[8],int,char>(pJVar4,(char (*) [8])"pr_flag",&local_44,local_2b + 2);
  local_2b[3] = 0;
  pJVar4 = JObject::field<char[7],unsigned_int,char>
                     (pJVar4,(char (*) [7])"pr_uid",&peVar1->pr_uid,local_2b + 3);
  local_2b[4] = 0;
  pJVar4 = JObject::field<char[7],unsigned_int,char>
                     (pJVar4,(char (*) [7])"pr_gid",&peVar1->pr_gid,local_2b + 4);
  local_2b[5] = 0;
  pJVar4 = JObject::field<char[7],int,char>
                     (pJVar4,(char (*) [7])"pr_pid",&peVar1->pr_pid,local_2b + 5);
  local_2b[6] = 0;
  pJVar4 = JObject::field<char[8],int,char>
                     (pJVar4,(char (*) [8])"pr_ppid",&peVar1->pr_ppid,local_2b + 6);
  local_2b[7] = 0;
  pJVar4 = JObject::field<char[8],int,char>
                     (pJVar4,(char (*) [8])"pr_pgrp",&peVar1->pr_pgrp,local_2b + 7);
  local_2b[8] = 0;
  pJVar4 = JObject::field<char[7],int,char>
                     (pJVar4,(char (*) [7])"pr_sid",&peVar1->pr_sid,local_2b + 8);
  local_2b[9] = 0;
  pJVar4 = JObject::field<char[9],std::__cxx11::string,char>
                     (pJVar4,(char (*) [9])"pr_fname",
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b0,
                      local_2b + 9);
  local_2b[10] = 0;
  pJVar4 = JObject::field<char[8],std::__cxx11::string,char>
                     (pJVar4,(char (*) [8])"pr_args",
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      ((long)&fname.field_2 + 8),local_2b + 10);
  poVar2 = pJVar4->os;
  std::__cxx11::string::~string((string *)(args.field_2._M_local_buf + 8));
  JObject::~JObject(&local_40);
  std::__cxx11::string::~string((string *)(fname.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)local_b0);
  return poVar2;
}

Assistant:

std::ostream &
operator <<(std::ostream &os, const JSON<prpsinfo_t> &jo)
{
    auto &pr = jo.object;

    std::string fname = { pr.pr_fname, strnlen( pr.pr_fname, sizeof pr.pr_fname ) };
    std::string args = { pr.pr_psargs, strnlen( pr.pr_psargs, sizeof pr.pr_psargs ) };

    return JObject(os)
        .field("pr_state", int( pr.pr_state ) )
        .field("pr_sname", std::string(&pr.pr_sname, 1))
        .field("pr_zomb", bool(pr.pr_zomb))
        .field("pr_nice", int (pr.pr_nice))
        .field("pr_flag", int(pr.pr_flag))
        .field("pr_uid", pr.pr_uid )
        .field("pr_gid", pr.pr_gid )
        .field("pr_pid", pr.pr_pid )
        .field("pr_ppid", pr.pr_ppid )
        .field("pr_pgrp", pr.pr_pgrp )
        .field("pr_sid", pr.pr_sid )
        .field("pr_fname", fname )
        .field("pr_args", args )
              ;
}